

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

double __thiscall
duckdb::Interpolator<false>::Operation<double,double,duckdb::MadAccessor<double,double,double>>
          (Interpolator<false> *this,double *v_t,Vector *result,
          MadAccessor<double,_double,_double> *accessor)

{
  QuantileCompare<duckdb::MadAccessor<double,_double,_double>_> __comp;
  QuantileCompare<duckdb::MadAccessor<double,_double,_double>_> __comp_00;
  QuantileCompare<duckdb::MadAccessor<double,_double,_double>_> __comp_01;
  MadAccessor<double,_double,_double> *in_RCX;
  MadAccessor<double,_double,_double> *in_RDI;
  undefined1 auVar1 [16];
  double hi;
  double lo;
  QuantileCompare<duckdb::MadAccessor<double,_double,_double>_> comp;
  double local_b0;
  RESULT_TYPE_conflict4 local_a8;
  double local_a0 [6];
  double *in_stack_ffffffffffffff90;
  MadAccessor<double,_double,_double> *__last;
  double *in_stack_ffffffffffffff98;
  double *pdVar2;
  double *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc0;
  MadAccessor<double,_double,_double> *pMStack_38;
  double *local_30;
  double local_8;
  
  QuantileCompare<duckdb::MadAccessor<double,_double,_double>_>::QuantileCompare
            ((QuantileCompare<duckdb::MadAccessor<double,_double,_double>_> *)
             &stack0xffffffffffffffc0,in_RCX,(bool)(*(byte *)&in_RDI->median & 1));
  if (in_RDI[3].median == in_RDI[2].median) {
    __comp.accessor_r = (MadAccessor<double,_double,_double> *)local_30;
    __comp.accessor_l = pMStack_38;
    __comp._16_8_ = in_stack_ffffffffffffffc0;
    ::std::nth_element<double*,duckdb::QuantileCompare<duckdb::MadAccessor<double,double,double>>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,__comp)
    ;
    MadAccessor<double,_double,_double>::operator()(in_RDI,local_30);
    local_8 = CastInterpolation::Cast<double,double>((double *)pMStack_38,in_stack_ffffffffffffffc0)
    ;
  }
  else {
    __comp_00.accessor_r = (MadAccessor<double,_double,_double> *)in_stack_ffffffffffffffb8;
    __comp_00.accessor_l = (MadAccessor<double,_double,_double> *)in_stack_ffffffffffffffb0;
    __comp_00._16_8_ = in_stack_ffffffffffffffc0;
    __last = pMStack_38;
    pdVar2 = local_30;
    ::std::nth_element<double*,duckdb::QuantileCompare<duckdb::MadAccessor<double,double,double>>>
              (in_stack_ffffffffffffffa0,local_30,(double *)pMStack_38,__comp_00);
    __comp_01.accessor_r = (MadAccessor<double,_double,_double> *)in_stack_ffffffffffffffb8;
    __comp_01.accessor_l = (MadAccessor<double,_double,_double> *)in_stack_ffffffffffffffb0;
    __comp_01._16_8_ = in_stack_ffffffffffffffc0;
    ::std::nth_element<double*,duckdb::QuantileCompare<duckdb::MadAccessor<double,double,double>>>
              (in_stack_ffffffffffffffa0,pdVar2,(double *)__last,__comp_01);
    local_a8 = MadAccessor<double,_double,_double>::operator()(in_RDI,local_30);
    local_a0[0] = CastInterpolation::Cast<double,double>
                            ((double *)pMStack_38,in_stack_ffffffffffffffc0);
    MadAccessor<double,_double,_double>::operator()(in_RDI,local_30);
    local_b0 = CastInterpolation::Cast<double,double>
                         ((double *)pMStack_38,in_stack_ffffffffffffffc0);
    pdVar2 = in_RDI[2].median;
    auVar1._8_4_ = (int)((ulong)pdVar2 >> 0x20);
    auVar1._0_8_ = pdVar2;
    auVar1._12_4_ = 0x45300000;
    local_8 = CastInterpolation::Interpolate<double>
                        (local_a0,(double)in_RDI[1].median -
                                  ((auVar1._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)pdVar2) - 4503599627370496.0)),
                         &local_b0);
  }
  return local_8;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}